

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O2

string * phosg::get_user_home_directory_abi_cxx11_(void)

{
  __uid_t __uid;
  int iVar1;
  char *__s;
  long lVar2;
  runtime_error *prVar3;
  string *in_RDI;
  allocator<char> local_71;
  passwd *result;
  string buffer;
  passwd pwd;
  
  __s = getenv("HOME");
  if (__s == (char *)0x0) {
    lVar2 = sysconf(0x46);
    iVar1 = (int)lVar2;
    if (iVar1 == -1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar3,"can\'t get _SC_GETPW_R_SIZE_MAX");
      __cxa_throw(prVar3,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&buffer,(long)iVar1,'\0');
    result = (passwd *)0x0;
    __uid = getuid();
    iVar1 = getpwuid_r(__uid,(passwd *)&pwd,buffer._M_dataplus._M_p,(long)iVar1,(passwd **)&result);
    if ((iVar1 != 0) || (result == (passwd *)0x0)) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar3,"can\'t get home directory for current user");
      __cxa_throw(prVar3,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,pwd.pw_dir,&local_71);
    ::std::__cxx11::string::~string((string *)&buffer);
  }
  else {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)in_RDI,__s,(allocator<char> *)&pwd);
  }
  return in_RDI;
}

Assistant:

string get_user_home_directory() {
  const char* homedir = getenv("HOME");
  if (homedir) {
    return homedir;
  }

  int bufsize = sysconf(_SC_GETPW_R_SIZE_MAX);
  if (bufsize == -1) {
    throw runtime_error("can\'t get _SC_GETPW_R_SIZE_MAX");
  }

  string buffer(bufsize, '\0');
  struct passwd pwd, *result = nullptr;
  if (getpwuid_r(getuid(), &pwd, buffer.data(), bufsize, &result) != 0 || !result) {
    throw runtime_error("can\'t get home directory for current user");
  }

  return pwd.pw_dir;
}